

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::UpdateParser::~UpdateParser(UpdateParser *this)

{
  UpdateParser *this_local;
  
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__UpdateParser_01101238;
  cmsys::RegularExpression::~RegularExpression(&this->RegexUpdate);
  cmProcessTools::LineParser::~LineParser(&this->super_LineParser);
  return;
}

Assistant:

UpdateParser(cmCTestSVN* svn, const char* prefix)
    : SVN(svn)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexUpdate.compile("^([ADUCGE ])([ADUCGE ])[B ] +(.+)$");
  }